

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O3

void __thiscall duckdb::Executor::InitializeInternal(Executor *this,PhysicalOperator *plan)

{
  _Head_base<0UL,_duckdb::ProducerToken_*,_false> this_00;
  PhysicalOperator *pPVar1;
  pointer prVar2;
  int iVar3;
  DatabaseInstance *this_01;
  ClientData *other;
  QueryProfiler *this_02;
  MetaPipeline *pMVar4;
  reference this_03;
  type pPVar5;
  PhysicalRecursiveCTE *pPVar6;
  reference_wrapper<duckdb::PhysicalOperator> *rec_cte_ref;
  pointer prVar7;
  shared_ptr<duckdb::MetaPipeline,_true> root_pipeline;
  vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_true> to_schedule;
  PipelineBuildState state;
  undefined1 local_c9;
  shared_ptr<duckdb::MetaPipeline,_true> local_c8;
  vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
  local_b8;
  void *local_a0;
  undefined1 local_98 [48];
  undefined1 auStack_68 [16];
  __native_type local_58;
  atomic<unsigned_long> aStack_30;
  
  this_01 = DatabaseInstance::GetDatabase(this->context);
  DatabaseInstance::GetScheduler(this_01);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->executor_lock);
  if (iVar3 == 0) {
    (this->physical_plan).ptr = plan;
    other = ClientData::Get(this->context);
    shared_ptr<duckdb::QueryProfiler,_true>::operator=(&this->profiler,&other->profiler);
    this_02 = shared_ptr<duckdb::QueryProfiler,_true>::operator->(&this->profiler);
    QueryProfiler::Initialize(this_02,plan);
    TaskScheduler::CreateProducer((TaskScheduler *)local_98);
    this_00._M_head_impl =
         (this->producer).
         super_unique_ptr<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>_>._M_t.
         super___uniq_ptr_impl<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ProducerToken_*,_std::default_delete<duckdb::ProducerToken>_>
         .super__Head_base<0UL,_duckdb::ProducerToken_*,_false>._M_head_impl;
    (this->producer).
    super_unique_ptr<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>_>._M_t.
    super___uniq_ptr_impl<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ProducerToken_*,_std::default_delete<duckdb::ProducerToken>_>.
    super__Head_base<0UL,_duckdb::ProducerToken_*,_false>._M_head_impl =
         (ProducerToken *)local_98._0_8_;
    if (this_00._M_head_impl != (ProducerToken *)0x0) {
      ProducerToken::~ProducerToken(this_00._M_head_impl);
      operator_delete(this_00._M_head_impl);
    }
    local_98._0_8_ = auStack_68;
    local_98._8_8_ =
         (__uniq_ptr_data<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true,_true>
          )0x1;
    local_98._16_8_ = 0;
    local_98._24_8_ = 0;
    local_98._32_4_ = 0x3f800000;
    local_98._40_8_ = (__pthread_internal_list *)0x0;
    auStack_68._0_8_ = (__pthread_internal_list *)0x0;
    auStack_68._8_8_ = &aStack_30;
    local_58.__align = (long)&DAT_00000001;
    local_58._8_8_ = (pointer)0x0;
    local_58._16_8_ = (pointer)0x0;
    local_58._24_4_ = 0x3f800000;
    local_58.__data.__list.__next = (__pthread_internal_list *)0x0;
    aStack_30.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    local_a0 = (void *)0x0;
    local_b8.
    super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::MetaPipeline,std::allocator<duckdb::MetaPipeline>,duckdb::Executor&,duckdb::PipelineBuildState&,decltype(nullptr)>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_b8.
                super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,(MetaPipeline **)&local_b8,
               (allocator<duckdb::MetaPipeline> *)&local_c9,this,(PipelineBuildState *)local_98,
               &local_a0);
    shared_ptr<duckdb::MetaPipeline,_true>::shared_ptr
              (&local_c8,(shared_ptr<duckdb::MetaPipeline> *)&local_b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_b8.
        super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_b8.
                 super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    pMVar4 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(&local_c8);
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&this->physical_plan);
    pPVar1 = (this->physical_plan).ptr;
    this_03 = vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true>::back(&pMVar4->pipelines);
    pPVar5 = shared_ptr<duckdb::Pipeline,_true>::operator*(this_03);
    (*pPVar1->_vptr_PhysicalOperator[0x26])(pPVar1,pPVar5,pMVar4);
    pMVar4 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(&local_c8);
    MetaPipeline::Ready(pMVar4);
    prVar2 = (this->recursive_ctes).
             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (prVar7 = (this->recursive_ctes).
                  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; prVar7 != prVar2; prVar7 = prVar7 + 1)
    {
      pPVar6 = PhysicalOperator::Cast<duckdb::PhysicalRecursiveCTE>(prVar7->_M_data);
      pMVar4 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(&pPVar6->recursive_meta_pipeline);
      MetaPipeline::Ready(pMVar4);
    }
    pMVar4 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(&local_c8);
    ::std::
    vector<duckdb::shared_ptr<duckdb::Pipeline,true>,std::allocator<duckdb::shared_ptr<duckdb::Pipeline,true>>>
    ::
    _M_range_insert<__gnu_cxx::__normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,true>*,std::vector<duckdb::shared_ptr<duckdb::Pipeline,true>,std::allocator<duckdb::shared_ptr<duckdb::Pipeline,true>>>>>
              ((vector<duckdb::shared_ptr<duckdb::Pipeline,true>,std::allocator<duckdb::shared_ptr<duckdb::Pipeline,true>>>
                *)&this->root_pipelines,
               (this->root_pipelines).
               super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
               .
               super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (pMVar4->pipelines).
               super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
               .
               super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (pMVar4->pipelines).
               super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
               .
               super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    this->root_pipeline_idx = 0;
    local_b8.
    super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.
    super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pMVar4 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(&local_c8);
    MetaPipeline::GetMetaPipelines
              (pMVar4,(vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_true> *)&local_b8,true
               ,true);
    this->total_pipelines =
         (long)local_b8.
               super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_b8.
               super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 4;
    pMVar4 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(&local_c8);
    MetaPipeline::GetPipelines(pMVar4,&this->pipelines,true);
    ScheduleEvents(this,(vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_true> *)&local_b8);
    ::std::
    vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
    ::~vector(&local_b8);
    if (local_c8.internal.super___shared_ptr<duckdb::MetaPipeline,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.internal.
                 super___shared_ptr<duckdb::MetaPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    ::std::
    _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(auStack_68 + 8));
    ::std::
    _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_98);
    pthread_mutex_unlock((pthread_mutex_t *)&this->executor_lock);
    return;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

void Executor::InitializeInternal(PhysicalOperator &plan) {

	auto &scheduler = TaskScheduler::GetScheduler(context);
	{
		lock_guard<mutex> elock(executor_lock);
		physical_plan = &plan;

		this->profiler = ClientData::Get(context).profiler;
		profiler->Initialize(plan);
		this->producer = scheduler.CreateProducer();

		// build and ready the pipelines
		PipelineBuildState state;
		auto root_pipeline = make_shared_ptr<MetaPipeline>(*this, state, nullptr);
		root_pipeline->Build(*physical_plan);
		root_pipeline->Ready();

		// ready recursive cte pipelines too
		for (auto &rec_cte_ref : recursive_ctes) {
			auto &rec_cte = rec_cte_ref.get().Cast<PhysicalRecursiveCTE>();
			rec_cte.recursive_meta_pipeline->Ready();
		}

		// set root pipelines, i.e., all pipelines that end in the final sink
		root_pipeline->GetPipelines(root_pipelines, false);
		root_pipeline_idx = 0;

		// collect all meta-pipelines from the root pipeline
		vector<shared_ptr<MetaPipeline>> to_schedule;
		root_pipeline->GetMetaPipelines(to_schedule, true, true);

		// number of 'PipelineCompleteEvent's is equal to the number of meta pipelines, so we have to set it here
		total_pipelines = to_schedule.size();

		// collect all pipelines from the root pipelines (recursively) for the progress bar and verify them
		root_pipeline->GetPipelines(pipelines, true);

		// finally, verify and schedule
		VerifyPipelines();
		ScheduleEvents(to_schedule);
	}
}